

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void register_subpage(uc_struct_conflict15 *uc,FlatView *fv,MemoryRegionSection *section)

{
  undefined1 a [16];
  uint16_t uVar1;
  uint uVar2;
  AddressSpaceDispatch *d_00;
  ulong addr;
  MemoryRegionSection *pMVar3;
  uint64_t uVar5;
  undefined8 in_stack_ffffffffffffff10;
  MemoryRegion_conflict *__mptr;
  hwaddr end;
  hwaddr start;
  Int128 *local_88;
  MemoryRegionSection subsection;
  MemoryRegionSection *existing;
  hwaddr base;
  subpage_t *subpage;
  AddressSpaceDispatch *d;
  MemoryRegionSection *section_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  ulong uVar4;
  
  d_00 = flatview_to_dispatch(fv);
  uVar2 = (uint)section->offset_within_address_space;
  addr = (ulong)(uVar2 & 0xffffc000);
  uVar4 = addr;
  pMVar3 = phys_page_find(d_00,addr);
  local_88 = int128_make64((Int128 *)0x4000,uVar4);
  subsection.size._8_8_ = (subpage_t *)0x0;
  subsection.mr = (MemoryRegion *)0x0;
  subsection.fv = (FlatView *)0x0;
  subsection.offset_within_address_space._0_1_ = 0;
  subsection.offset_within_region = addr;
  if (((pMVar3->mr->subpage & 1U) == 0) && (pMVar3->mr != &section->mr->uc->io_mem_unassigned)) {
    __assert_fail("existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x372,
                  "void register_subpage(struct uc_struct *, FlatView *, MemoryRegionSection *)");
  }
  if ((pMVar3->mr->subpage & 1U) == 0) {
    base = (hwaddr)subpage_init(uc,fv,addr);
    subsection.size._8_8_ = (subpage_t *)base;
    subsection.mr = (MemoryRegion *)fv;
    uVar1 = phys_section_add(uc,&d_00->map,(MemoryRegionSection *)&local_88);
    phys_page_set(d_00,(ulong)(uVar2 >> 0xe),1,uVar1);
  }
  else {
    base = (hwaddr)pMVar3->mr;
  }
  uVar2 = (uint)section->offset_within_address_space & 0x3fff;
  uVar4 = CONCAT44(0,uVar2);
  a._8_8_ = in_stack_ffffffffffffff10;
  a._0_8_ = uVar4;
  uVar5 = int128_get64((Int128)a);
  uVar1 = phys_section_add(uc,&d_00->map,section);
  subpage_register(uc,(subpage_t *)base,uVar2,((int)uVar4 + (int)uVar5) - 1,uVar1);
  return;
}

Assistant:

static void register_subpage(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    AddressSpaceDispatch *d = flatview_to_dispatch(fv);
    subpage_t *subpage;
    hwaddr base = section->offset_within_address_space
        & TARGET_PAGE_MASK;
    MemoryRegionSection *existing = phys_page_find(d, base);
    MemoryRegionSection subsection = {
        .offset_within_address_space = base,
        .size = int128_make64(TARGET_PAGE_SIZE),
    };
    hwaddr start, end;

    assert(existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned));

    if (!(existing->mr->subpage)) {
        subpage = subpage_init(uc, fv, base);
        subsection.fv = fv;
        subsection.mr = &subpage->iomem;
        phys_page_set(d, base >> TARGET_PAGE_BITS, 1,
                      phys_section_add(uc, &d->map, &subsection));
    } else {
        subpage = container_of(existing->mr, subpage_t, iomem);
    }
    start = section->offset_within_address_space & ~TARGET_PAGE_MASK;
    end = start + int128_get64(section->size) - 1;
    subpage_register(uc, subpage, start, end,
                     phys_section_add(uc, &d->map, section));
}